

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O1

void __thiscall
QPixmapConvolutionFilter::draw
          (QPixmapConvolutionFilter *this,QPainter *painter,QPointF *p,QPixmap *src,QRectF *srcRect)

{
  long lVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  Representation RVar5;
  long *plVar6;
  QImage *pQVar7;
  long lVar8;
  ulong uVar9;
  undefined4 extraout_EDX;
  uint uVar10;
  QImage *destImage;
  qreal *pqVar11;
  ulong uVar12;
  QTransform *pQVar13;
  QRectF *destImage_00;
  long in_FS_OFFSET;
  byte bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  QRect QVar23;
  QPointF local_e8;
  qreal local_d8;
  qreal qStack_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  QRectF local_a8;
  QTransform mat;
  
  bVar14 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QPixmapFilter).field_0x8;
  cVar3 = QPainter::isActive();
  if ((((cVar3 == '\0') || (*(int *)(lVar2 + 0x88) < 1)) || (*(int *)(lVar2 + 0x8c) < 1)) ||
     (cVar3 = QPixmap::isNull(), cVar3 != '\0')) goto LAB_0039c582;
  QPainter::paintEngine();
  plVar6 = (long *)QPaintEngine::paintDevice();
  iVar4 = (**(code **)(*plVar6 + 0x10))(plVar6);
  if (iVar4 == 3) {
    QPainter::paintEngine();
    pQVar7 = (QImage *)QPaintEngine::paintDevice();
    pqVar11 = (qreal *)&DAT_006dd408;
    pQVar13 = &mat;
    for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pQVar13->m_matrix[0][0] = *pqVar11;
      pqVar11 = pqVar11 + (ulong)bVar14 * -2 + 1;
      pQVar13 = (QTransform *)((long)pQVar13 + ((ulong)bVar14 * -2 + 1) * 8);
    }
    QPainter::combinedTransform();
    iVar4 = QTransform::type();
    if (1 < iVar4) goto LAB_0039c2a6;
    QPainter::paintEngine();
    iVar4 = QRasterPaintEngine::clipType();
    if (iVar4 == 1) goto LAB_0039c2a6;
    local_a8.w = -NAN;
    local_a8.h = -NAN;
    local_a8.xp = -NAN;
    local_a8.yp = -NAN;
    QRasterPaintEngine::clipBoundingRect();
    local_b8 = 0xffffffff;
    uStack_b4 = 0xffffffff;
    uStack_b0 = 0xffffffff;
    uStack_ac = 0xffffffff;
    local_c8 = 0xffffffff;
    uStack_c4 = 0xffffffff;
    uStack_c0 = 0xffffffff;
    uStack_bc = 0xffffffff;
    if ((srcRect->w <= 0.0) || (srcRect->h <= 0.0)) {
      auVar21 = QPixmap::rect();
      local_e8.xp = (qreal)auVar21._0_4_;
      local_e8.yp = (qreal)auVar21._4_4_;
      local_d8 = (qreal)(((long)auVar21._8_4_ - (long)auVar21._0_4_) + 1);
      qStack_d0 = (qreal)(((auVar21._8_8_ >> 0x20) - (auVar21._0_8_ >> 0x20)) + 1);
    }
    else {
      local_e8.xp = srcRect->xp;
      local_e8.yp = srcRect->yp;
      local_d8 = srcRect->w;
      qStack_d0 = srcRect->h;
    }
    (**(code **)(*(long *)&this->super_QPixmapFilter + 0x60))(&local_c8,this,&local_e8);
    lVar8 = QPainter::deviceTransform();
    local_e8.xp = p->xp + *(double *)(lVar8 + 0x30) + (double)CONCAT44(uStack_c4,local_c8);
    local_e8.yp = p->yp + *(double *)(lVar8 + 0x38) + (double)CONCAT44(uStack_bc,uStack_c0);
    local_d8 = (qreal)CONCAT44(uStack_b4,local_b8);
    qStack_d0 = (qreal)CONCAT44(uStack_ac,uStack_b0);
    cVar3 = QRectF::contains(&local_a8);
    destImage = (QImage *)0x0;
    if (cVar3 != '\0') {
      destImage = pQVar7;
    }
  }
  else {
LAB_0039c2a6:
    destImage = (QImage *)0x0;
  }
  if (destImage == (QImage *)0x0) {
    if (((srcRect->w != 0.0) || (NAN(srcRect->w))) || ((srcRect->h != 0.0 || (NAN(srcRect->h))))) {
      QVar23 = QRectF::toRect(srcRect);
    }
    else {
      QVar23 = (QRect)QPixmap::rect();
    }
    RVar5 = QVar23.x1.m_i;
    dVar18 = (double)(((long)QVar23.x2.m_i.m_i - (long)RVar5.m_i) + 1);
    dVar19 = (double)(((QVar23._8_8_ >> 0x20) - (QVar23._0_8_ >> 0x20)) + 1);
    dVar16 = (double)QVar23.y1.m_i.m_i;
    local_a8.xp = (double)RVar5.m_i;
    local_a8.yp = dVar16;
    local_a8.w = dVar18;
    local_a8.h = dVar19;
    (**(code **)(*(long *)&this->super_QPixmapFilter + 0x60))(&mat,this,&local_a8);
    auVar22._0_8_ =
         (double)((ulong)mat.m_matrix[0][0] & 0x8000000000000000 | 0x3fe0000000000000) +
         mat.m_matrix[0][0];
    auVar22._8_8_ =
         (double)((ulong)mat.m_matrix[0][1] & 0x8000000000000000 | 0x3fe0000000000000) +
         mat.m_matrix[0][1];
    auVar21 = minpd(_DAT_0066f5d0,auVar22);
    auVar22 = maxpd(auVar21,_DAT_0066f5e0);
    dVar15 = (mat.m_matrix[0][0] - (double)(int)auVar22._0_8_) * 0.5 + mat.m_matrix[0][2];
    dVar17 = (mat.m_matrix[0][1] - (double)(int)auVar22._8_8_) * 0.5 + mat.m_matrix[1][0];
    auVar21._0_8_ = (double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) + dVar15;
    auVar21._8_8_ = (double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000) + dVar17;
    auVar21 = minpd(_DAT_0066f5d0,auVar21);
    auVar20._8_8_ = -(ulong)(DAT_0066f5e0._8_8_ < auVar21._8_8_);
    auVar20._0_8_ = -(ulong)((double)DAT_0066f5e0 < auVar21._0_8_);
    uVar10 = movmskpd(extraout_EDX,auVar20);
    local_a8.w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    uVar12 = 0x8000000000000000;
    if ((uVar10 & 2) != 0) {
      uVar12 = (ulong)(uint)(int)auVar21._8_8_ << 0x20;
    }
    uVar9 = 0x80000000;
    if ((uVar10 & 1) != 0) {
      uVar9 = (ulong)(uint)(int)auVar21._0_8_;
    }
    mat.m_matrix[0][0] = (qreal)(uVar9 | uVar12);
    QImage::QImage((QImage *)&local_a8,(QSize *)&mat,Format_ARGB32_Premultiplied);
    dVar15 = (double)(RVar5.m_i - (int)auVar22._0_8_);
    dVar17 = (double)(QVar23.y1.m_i.m_i - (int)auVar22._8_8_);
    local_e8.xp = dVar15;
    local_e8.yp = dVar17;
    QPixmap::toImage();
    destImage_00 = &local_a8;
    mat.m_matrix[0][0] = (double)RVar5.m_i;
    mat.m_matrix[0][1] = dVar16;
    mat.m_matrix[0][2] = dVar18;
    mat.m_matrix[1][0] = dVar19;
    convolute((QImage *)destImage_00,&local_e8,(QImage *)&local_c8,(QRectF *)&mat,
              CompositionMode_Source,*(qreal **)(lVar2 + 0x80),*(int *)(lVar2 + 0x88),
              *(int *)(lVar2 + 0x8c));
    QImage::~QImage((QImage *)&local_c8);
    mat.m_matrix[0][0] = p->xp - dVar15;
    mat.m_matrix[0][1] = p->yp - dVar17;
    QPainter::drawImage((QPointF *)painter,(QImage *)&mat);
  }
  else {
    lVar8 = QPainter::deviceTransform();
    local_a8.xp = p->xp + *(double *)(lVar8 + 0x30);
    local_a8.yp = p->yp + *(double *)(lVar8 + 0x38);
    destImage_00 = (QRectF *)&mat;
    QPixmap::toImage();
    convolute(destImage,(QPointF *)&local_a8,(QImage *)destImage_00,srcRect,
              CompositionMode_SourceOver,*(qreal **)(lVar2 + 0x80),*(int *)(lVar2 + 0x88),
              *(int *)(lVar2 + 0x8c));
  }
  QImage::~QImage((QImage *)destImage_00);
LAB_0039c582:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapConvolutionFilter::draw(QPainter *painter, const QPointF &p, const QPixmap &src, const QRectF& srcRect) const
{
    Q_D(const QPixmapConvolutionFilter);
    if (!painter->isActive())
        return;

    if (d->kernelWidth<=0 || d->kernelHeight <= 0)
        return;

    if (src.isNull())
        return;

    // raster implementation

    QImage *target = nullptr;
    if (painter->paintEngine()->paintDevice()->devType() == QInternal::Image) {
        target = static_cast<QImage *>(painter->paintEngine()->paintDevice());

        QTransform mat = painter->combinedTransform();

        if (mat.type() > QTransform::TxTranslate) {
            // Disabled because of transformation...
            target = nullptr;
        } else {
            QRasterPaintEngine *pe = static_cast<QRasterPaintEngine *>(painter->paintEngine());
            if (pe->clipType() == QRasterPaintEngine::ComplexClip)
                // disabled because of complex clipping...
                target = nullptr;
            else {
                QRectF clip = pe->clipBoundingRect();
                QRectF rect = boundingRectFor(srcRect.isEmpty() ? src.rect() : srcRect);
                QTransform x = painter->deviceTransform();
                if (!clip.contains(rect.translated(x.dx() + p.x(), x.dy() + p.y()))) {
                    target = nullptr;
                }

            }
        }
    }

    if (target) {
        QTransform x = painter->deviceTransform();
        QPointF offset(x.dx(), x.dy());

        convolute(target, p+offset, src.toImage(), srcRect, QPainter::CompositionMode_SourceOver, d->convolutionKernel, d->kernelWidth, d->kernelHeight);
    } else {
        QRect srect = srcRect.isNull() ? src.rect() : srcRect.toRect();
        QRect rect = boundingRectFor(srect).toRect();
        QImage result = QImage(rect.size(), QImage::Format_ARGB32_Premultiplied);
        QPoint offset = srect.topLeft() - rect.topLeft();
        convolute(&result,
                  offset,
                  src.toImage(),
                  srect,
                  QPainter::CompositionMode_Source,
                  d->convolutionKernel,
                  d->kernelWidth,
                  d->kernelHeight);
        painter->drawImage(p - offset, result);
    }
}